

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O2

void LoadMapinfoACSLump(void)

{
  level_info_t *this;
  int lumpnum;
  FEDOptions *pFVar1;
  FName local_14;
  
  this = level.info;
  FName::FName(&local_14,"EData");
  pFVar1 = level_info_t::GetOptData<FEDOptions>(this,&local_14,false);
  if (pFVar1 != (FEDOptions *)0x0) {
    lumpnum = FWadCollection::CheckNumForName(&Wads,&pFVar1->acsName);
    if (-1 < lumpnum) {
      FBehavior::StaticLoadModule(lumpnum,(FileReader *)0x0,0);
    }
  }
  return;
}

Assistant:

void LoadMapinfoACSLump()
{
	FEDOptions *opt = level.info->GetOptData<FEDOptions>("EData", false);
	if (opt != NULL)
	{
		int lump = Wads.CheckNumForName(opt->acsName);
		if (lump >= 0) FBehavior::StaticLoadModule(lump);
	}
}